

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta,float obj_amp)

{
  int k;
  rc_data *begin;
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint r_size;
  int iVar4;
  int *piVar5;
  bool bVar6;
  long lVar7;
  int bk_max;
  long lVar8;
  string_view fmt;
  float theta_local;
  float delta_local;
  float kappa_local;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  theta_local = theta;
  delta_local = delta;
  kappa_local = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&kappa_local,&delta_local,&theta_local);
  bVar6 = false;
  piVar5 = (first->current)._M_current;
  do {
    if (piVar5 == (last->current)._M_current) {
      return bVar6;
    }
    k = piVar5[-1];
    lVar8 = (long)k;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
    ::decrease_preference
              ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               theta_local);
    r_size = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                         *)this,it.
                                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                                .
                                super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                ._M_head_impl,
                        (row_iterator)
                        it.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                        .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                        super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl,x);
    begin = *(rc_data **)(this + 0x60);
    lVar1 = *(long *)(this + 0x160);
    for (lVar7 = 0; (ulong)r_size * 0xc - lVar7 != 0; lVar7 = lVar7 + 0xc) {
      auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(lVar1 + 8) +
                                                (long)it.
                                                  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                                                  .
                                                  super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                                  ._M_head_impl[*(int *)((long)&begin->id + lVar7)].
                                                  column * 4)),ZEXT416((uint)obj_amp),
                               ZEXT416(*(uint *)((long)&begin->value + lVar7)));
      *(int *)((long)&begin->value + lVar7) = auVar2._0_4_;
    }
    switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar8)) {
    case 0:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      iVar4 = *(int *)(*(long *)(this + 0x70) + lVar8 * 0xc);
      bk_max = *(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc);
LAB_00494442:
      iVar4 = branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
                        ((branch_and_bound_solver<baryonyx::itm::minimize_tag,float> *)(this + 0x80)
                         ,(unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                           *)(this + 0x60),r_size,iVar4,bk_max);
      break;
    case 1:
switchD_004943d7_caseD_1:
      iVar4 = exhaustive_solver<baryonyx::itm::minimize_tag,float>::
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
                        ((exhaustive_solver<baryonyx::itm::minimize_tag,float> *)(this + 0xe8),k,
                         (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                          *)(this + 0x60),r_size);
      break;
    case 2:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      lVar8 = lVar8 * 0xc;
      iVar4 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              ::select_variables((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                                  *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar8),
                                 *(int *)(*(long *)(this + 0x70) + 4 + lVar8));
      if (iVar4 == -2) {
        iVar4 = *(int *)(*(long *)(this + 0x70) + lVar8);
        bk_max = *(int *)(*(long *)(this + 0x70) + 4 + lVar8);
        goto LAB_00494442;
      }
      break;
    case 3:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      iVar4 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              ::select_variables((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                                  *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar8 * 0xc),
                                 *(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc));
      if (iVar4 == -2) goto switchD_004943d7_caseD_1;
      break;
    default:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      iVar4 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              ::select_variables_101
                        ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar8 * 0xc),
                         *(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc));
    }
    bVar3 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                      (this,x,it.
                              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                              .
                              super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                              ._M_head_impl,k,iVar4,r_size,kappa_local,delta_local);
    bVar6 = (bool)(bVar6 | bVar3);
    piVar5 = (first->current)._M_current + -1;
    (first->current)._M_current = piVar5;
  } while( true );
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }